

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O1

void __thiscall IRBuilder::InsertLabels(IRBuilder *this)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  Kind KVar4;
  Type pBVar5;
  long *plVar6;
  code *pcVar7;
  bool bVar8;
  uint32 byteCodeOffset;
  undefined4 *puVar9;
  Type *ppBVar10;
  JITLoopHeaderIDL *pJVar11;
  MultiBranchInstr *branchRef;
  long lVar12;
  LabelInstr *pLVar13;
  ulong uVar14;
  long *plVar15;
  long lVar16;
  BranchInstr *pBVar17;
  int iVar18;
  long lVar19;
  undefined1 local_88 [8];
  Iterator iter;
  uint local_4c;
  BranchInstr *pBStack_48;
  uint offset;
  IRBuilder *local_40;
  uint local_34;
  
  if (this->branchRelocList == (SList<BranchReloc_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x3c5,"(this->branchRelocList)","Malformed branch reloc list");
    if (!bVar8) {
LAB_004cf67b:
      pcVar7 = (code *)invalidInstructionException();
      (*pcVar7)();
    }
    *puVar9 = 0;
  }
  local_88 = (undefined1  [8])this->branchRelocList;
  iter.list = (SListBase<BranchReloc_*,_Memory::ArenaAllocator,_RealCount> *)local_88;
  puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  local_40 = this;
LAB_004cf226:
  if (iter.list == (SListBase<BranchReloc_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar9 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                       ,0x76,"(current != nullptr)","current != nullptr");
    if (!bVar8) goto LAB_004cf67b;
    *puVar9 = 0;
  }
  iter.list = (SListBase<BranchReloc_*,_Memory::ArenaAllocator,_RealCount> *)
              ((iter.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
  if ((undefined1  [8])iter.list == local_88) {
    return;
  }
  ppBVar10 = SListBase<BranchReloc_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                       ((Iterator *)local_88);
  pBVar5 = *ppBVar10;
  pBStack_48 = pBVar5->branchInstr;
  uVar2 = pBVar5->offset;
  uVar3 = pBVar5->branchOffset;
  local_4c = uVar2;
  bVar8 = JITTimeWorkItem::IsLoopBody(this->m_func->m_workItem);
  if ((bVar8) &&
     (pJVar11 = JITTimeWorkItem::GetLoopHeader(this->m_func->m_workItem),
     pJVar11->endOffset + 1 < uVar2)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar9 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x3d1,"(!IsLoopBody() || offset <= GetLoopBodyExitInstrOffset())",
                       "!IsLoopBody() || offset <= GetLoopBodyExitInstrOffset()");
    if (!bVar8) goto LAB_004cf67b;
    *puVar9 = 0;
  }
  pBVar17 = pBStack_48;
  if ((pBStack_48->super_Instr).m_opcode == MultiBr) {
    if ((pBStack_48->super_Instr).m_kind != InstrKindBranch) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar9 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
      if (!bVar8) goto LAB_004cf67b;
      *puVar9 = 0;
    }
    branchRef = IR::BranchInstr::AsMultiBrInstr(pBVar17);
    plVar6 = (long *)branchRef->m_branchTargets;
    if (plVar6 == (long *)0x0) {
      pLVar13 = (LabelInstr *)0x0;
      this = local_40;
    }
    else {
      KVar4 = branchRef->m_kind;
      iter.current = (NodeBase *)branchRef;
      if ((KVar4 == IntJumpTable) || (KVar4 == SingleCharStrJumpTable)) {
        plVar15 = plVar6 + 1;
        lVar16 = branchRef->m_baseCaseValue;
        pBVar17 = pBStack_48;
        if (lVar16 <= branchRef->m_lastCaseValue) {
          lVar12 = *plVar6;
          do {
            lVar19 = lVar12 + branchRef->m_baseCaseValue * -8;
            local_34 = Math::PointerCastToIntegral<unsigned_int>(*(void **)(lVar19 + lVar16 * 8));
            pLVar13 = CreateLabel(local_40,pBStack_48,&local_34);
            if (pLVar13 != (LabelInstr *)0x0) {
              IR::LabelInstr::AddLabelRef(pLVar13,&branchRef->super_BranchInstr);
            }
            *(LabelInstr **)(lVar19 + lVar16 * 8) = pLVar13;
            lVar16 = lVar16 + 1;
            pBVar17 = pBStack_48;
          } while (lVar16 <= branchRef->m_lastCaseValue);
        }
      }
      else if (KVar4 == StrDictionary) {
        plVar15 = plVar6 + 7;
        if (*(int *)((long)plVar6 + 0x1c) != 0) {
          uVar14 = 0;
          do {
            iVar18 = *(int *)(*plVar6 + uVar14 * 4);
            while (iVar18 != -1) {
              lVar16 = plVar6[1];
              lVar12 = (long)iVar18;
              iVar18 = *(int *)(lVar16 + 8 + lVar12 * 0x18);
              local_34 = Math::PointerCastToIntegral<unsigned_int>
                                   (*(void **)(lVar16 + lVar12 * 0x18));
              pLVar13 = CreateLabel(local_40,pBStack_48,&local_34);
              if (pLVar13 != (LabelInstr *)0x0) {
                IR::LabelInstr::AddLabelRef(pLVar13,(BranchInstr *)iter.current);
              }
              *(LabelInstr **)(lVar16 + lVar12 * 0x18) = pLVar13;
            }
            uVar14 = uVar14 + 1;
            pBVar17 = pBStack_48;
          } while (uVar14 < *(uint *)((long)plVar6 + 0x1c));
        }
      }
      else {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar9 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                           ,0x435,"(false)","false");
        if (!bVar8) goto LAB_004cf67b;
        *puVar9 = 0;
        plVar15 = (long *)0x0;
      }
      this = local_40;
      local_34 = Math::PointerCastToIntegral<unsigned_int>((void *)*plVar15);
      pLVar13 = CreateLabel(this,pBVar17,&local_34);
      if (pLVar13 != (LabelInstr *)0x0) {
        IR::LabelInstr::AddLabelRef(pLVar13,(BranchInstr *)iter.current);
      }
      *plVar15 = (long)pLVar13;
    }
  }
  else {
    pLVar13 = CreateLabel(this,pBStack_48,&local_4c);
    if (pBVar17->m_isMultiBranch == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar9 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x1d3,"(!this->m_isMultiBranch)","!this->m_isMultiBranch");
      if (!bVar8) goto LAB_004cf67b;
      *puVar9 = 0;
    }
    if (pBVar17->m_branchTarget != (LabelInstr *)0x0) {
      IR::LabelInstr::RemoveLabelRef(pBVar17->m_branchTarget,pBVar17);
    }
    if (pLVar13 != (LabelInstr *)0x0) {
      IR::LabelInstr::AddLabelRef(pLVar13,pBVar17);
    }
    pBVar17->m_branchTarget = pLVar13;
  }
  if ((pBVar5->isNotBackEdge == false) && (local_4c <= uVar3)) {
    bVar1 = pLVar13->field_0x78;
    pLVar13->field_0x78 = bVar1 | 1;
    bVar8 = Func::IsJitInDebugMode(this->m_func);
    if (bVar8) {
      pBVar17 = pBVar5->branchInstr;
      byteCodeOffset = IR::Instr::GetByteCodeOffset(&pBVar17->super_Instr);
      InsertBailOutForDebugger
                (this,byteCodeOffset,BailOutBreakPointInFunction|BailOutForceByFlag,
                 &pBVar17->super_Instr);
    }
    if (((bVar1 & 1) == 0) && (this->m_loopCounterSym != (StackSym *)0x0)) {
      InsertIncrLoopBodyLoopCounter(this,pLVar13);
    }
  }
  goto LAB_004cf226;
}

Assistant:

void
IRBuilder::InsertLabels()
{
    AssertMsg(this->branchRelocList, "Malformed branch reloc list");

    SList<BranchReloc *>::Iterator iter(this->branchRelocList);

    while (iter.Next())
    {
        IR::LabelInstr * labelInstr = nullptr;
        BranchReloc * reloc = iter.Data();
        IR::BranchInstr * branchInstr = reloc->GetBranchInstr();
        uint offset = reloc->GetOffset();
        uint const branchOffset = reloc->GetBranchOffset();

        Assert(!IsLoopBody() || offset <= GetLoopBodyExitInstrOffset());

        if(branchInstr->m_opcode == Js::OpCode::MultiBr)
        {
            IR::MultiBranchInstr * multiBranchInstr = branchInstr->AsBranchInstr()->AsMultiBrInstr();

            multiBranchInstr->UpdateMultiBrTargetOffsets([&](uint32 offset) -> IR::LabelInstr *
            {
                labelInstr = this->CreateLabel(branchInstr, offset);
                multiBranchInstr->ChangeLabelRef(nullptr, labelInstr);
                return labelInstr;
            });
        }
        else
        {
            labelInstr = this->CreateLabel(branchInstr, offset);
            branchInstr->SetTarget(labelInstr);
        }

        if (!reloc->IsNotBackEdge() && branchOffset >= offset)
        {
            bool wasLoopTop = labelInstr->m_isLoopTop;
            labelInstr->m_isLoopTop = true;

            if (m_func->IsJitInDebugMode())
            {
                // Add bailout for Async Break.
                IR::BranchInstr* backEdgeBranchInstr = reloc->GetBranchInstr();
                this->InsertBailOutForDebugger(backEdgeBranchInstr->GetByteCodeOffset(), IR::BailOutForceByFlag | IR::BailOutBreakPointInFunction, backEdgeBranchInstr);
            }

            if (!wasLoopTop && m_loopCounterSym)
            {
                this->InsertIncrLoopBodyLoopCounter(labelInstr);
            }

        }
    }
}